

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ProductData * OpticsParser::parseBSDFXMLString(ProductData *__return_storage_ptr__,string *contents)

{
  ostream *poVar1;
  runtime_error *this;
  string local_6b0 [32];
  stringstream msg;
  ostream local_680 [376];
  optional<BSDFData::WindowElement> el;
  
  BSDFData::loadWindowElementFromString(&el,contents);
  if (el.super__Optional_base<BSDFData::WindowElement,_false,_false>._M_payload.
      super__Optional_payload<BSDFData::WindowElement,_true,_false,_false>.
      super__Optional_payload_base<BSDFData::WindowElement>._M_engaged == true) {
    convert(__return_storage_ptr__,(WindowElement *)&el);
    std::_Optional_payload_base<BSDFData::WindowElement>::_M_reset
              ((_Optional_payload_base<BSDFData::WindowElement> *)&el);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&msg);
  poVar1 = std::operator<<(local_680,"Cannot parse BSDFXML string: ");
  std::operator<<(poVar1,(string *)contents);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_6b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ProductData parseBSDFXMLString(std::string const & contents)
    {
        auto el = BSDFData::loadWindowElementFromString(contents);
        if(el.has_value())
        {
            return convert(*el);
        }

        // Tests are designed to throw exceptions if the file is not found.
        // This will allow tests to pass.
        std::stringstream msg;
        msg << "Cannot parse BSDFXML string: " << contents;
        throw std::runtime_error(msg.str());
    }